

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_chacha20poly1305(void)

{
  ptls_cipher_suite_t **pppVar1;
  ptls_cipher_suite_t **pppVar2;
  ptls_cipher_suite_t *cs2;
  ptls_cipher_suite_t *cs1;
  
  pppVar1 = ctx->cipher_suites;
  cs2 = *pppVar1;
  pppVar2 = pppVar1;
  cs1 = cs2;
  while (cs1 != (ptls_cipher_suite_t *)0x0) {
    pppVar2 = pppVar2 + 1;
    if (cs1->id == 0x1303) goto joined_r0x001163fc;
    cs1 = *pppVar2;
  }
  cs1 = (ptls_cipher_suite_t *)0x0;
joined_r0x001163fc:
  do {
    if (cs2 == (ptls_cipher_suite_t *)0x0) {
      cs2 = (ptls_cipher_suite_t *)0x0;
LAB_00116417:
      if ((cs1 != (ptls_cipher_suite_t *)0x0) && (cs2 != (ptls_cipher_suite_t *)0x0)) {
        test_ciphersuite(cs1,cs2);
        test_aad_ciphersuite(cs1,cs2);
        return;
      }
      return;
    }
    pppVar1 = pppVar1 + 1;
    if (cs2->id == 0x1303) goto LAB_00116417;
    cs2 = *pppVar1;
  } while( true );
}

Assistant:

static void test_chacha20poly1305(void)
{
    ptls_cipher_suite_t *cs = find_cipher(ctx, PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256),
                        *cs_peer = find_cipher(ctx, PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256);

    if (cs != NULL && cs_peer != NULL) {
        test_ciphersuite(cs, cs_peer);
        test_aad_ciphersuite(cs, cs_peer);
    }
}